

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get_value<std::vector<bool,std::allocator<bool>>>
          (Attribute *this,vector<bool,_std::allocator<bool>_> *v)

{
  optional<std::vector<bool,_std::allocator<bool>_>_> local_40;
  
  if ((v != (vector<bool,_std::allocator<bool>_> *)0x0) &&
     (primvar::PrimVar::get_value<std::vector<bool,std::allocator<bool>>>(&local_40,&this->_var),
     local_40.has_value_ != false)) {
    ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
              (&v->super__Bvector_base<std::allocator<bool>_>);
    (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)local_40.contained.data._0_8_;
    *(undefined8 *)
     &(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = local_40.contained._8_8_;
    (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)local_40.contained._16_8_;
    *(undefined8 *)
     &(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = local_40.contained._24_8_;
    (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)local_40.contained._32_8_;
    return true;
  }
  return false;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }